

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O2

ClauseIterator __thiscall
Inferences::FunctionDefinitionRewriting::generateClauses
          (FunctionDefinitionRewriting *this,Clause *premise)

{
  bool bVar1;
  _func_int **pp_Var2;
  long in_RDX;
  undefined1 local_2b8 [8];
  VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
  local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [24];
  OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> local_280 [4];
  undefined1 local_240 [8];
  undefined1 local_238 [72];
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [32];
  Value VStack_1c8;
  Value local_1b8;
  Value VStack_1b0;
  OptionBase<Kernel::Clause_*> local_198;
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  local_188;
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  local_158;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  local_128;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
  local_e0;
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  local_90;
  
  local_1e8._8_8_ = (Clause *)0x0;
  local_1e8._16_4_ = *(uint *)(in_RDX + 0x38) & 0xfffff;
  if (local_1e8._16_4_ == 0) {
    local_1e8._24_8_ = (Clause *)0x0;
    VStack_1c8 = (Value)0x0;
  }
  else {
    Lib::
    MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
    ::next((MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
            *)local_240);
    local_2a8._0_8_ = local_240;
    if (local_240 != (undefined1  [8])0x0) {
      *(int *)((long)local_240 + 8) = *(int *)((long)local_240 + 8) + 1;
    }
    Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::
    OptionBase((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> *)
               (local_1e8 + 0x18),
               (VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_> *)local_2a8);
    Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>::~VirtualIterator
              ((VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_> *)local_2a8);
    Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>::~VirtualIterator
              ((VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_> *)local_240);
  }
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_2a8,
             (FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_1f0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  ::FlatteningIterator
            (&local_188,
             (FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_2a8);
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            ((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> *)
             (local_298 + 0x10));
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            ((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> *)
             (local_1e8 + 0x18));
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  ::FlatteningIterator(&local_158,&local_188);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_2a8,&local_158);
  local_240 = (undefined1  [8])premise;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_238,
             (FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>
              *)local_2a8);
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            ((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> *)
             (local_298 + 0x10));
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_2a8,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_240);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_1f0,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_2a8);
  bVar1 = Lib::
          MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
          ::hasNext((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                     *)local_1f0);
  if (bVar1) {
    Lib::
    MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::next((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
            *)local_2b8);
    local_2b0._core =
         (IteratorCore<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
          *)local_2b8;
    if (local_2b8 != (undefined1  [8])0x0) {
      *(int *)((long)local_2b8 + 8) = *(int *)((long)local_2b8 + 8) + 1;
    }
    Lib::
    OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
    ::OptionBase((OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                  *)&local_1b8.init,&local_2b0);
    Lib::
    VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
    ::~VirtualIterator(&local_2b0);
    Lib::
    VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
    ::~VirtualIterator((VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>
                        *)local_2b8);
  }
  else {
    local_1b8 = (Value)0x0;
    VStack_1b0 = (Value)0x0;
  }
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            (local_280);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8,
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_1f0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            (&local_128,
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_1f0);
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            ((OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_> *)
             (local_238 + 0x20));
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            (&local_158._current.
              super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
            );
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_240,&local_128);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8,
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_240);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_1e8,
             (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_2a8);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_2a8,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_1f0);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>
  ::MappingIterator(&local_e0,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_2a8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(local_2a8 + 8));
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_1e8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_240);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_240,&local_e0);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_2a8,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_240);
  Lib::
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>
  ::MappingIterator((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_1e8,
                    (MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>
                     *)local_2a8);
  local_198._isSome = false;
  local_198._1_7_ = 0;
  local_198._elem._elem.init = (Value)0x0;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(local_2a8 + 8));
  Lib::
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)local_2a8,
                     (FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)local_1f0);
  Lib::
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  ::FilteredIterator(&local_90,
                     (FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)local_2a8);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_298);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)(local_1e8 + 8));
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_238);
  pp_Var2 = (_func_int **)Lib::alloc(0x78,8);
  Lib::
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)local_2a8,&local_90);
  *(undefined4 *)(pp_Var2 + 1) = 0;
  *pp_Var2 = (_func_int *)&PTR__ProxyIterator_009faca0;
  Lib::
  FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)(pp_Var2 + 2),
                     (FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:129:10),_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
                      *)local_2a8);
  (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.super_InferenceEngine
  ._vptr_InferenceEngine = pp_Var2;
  *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator
            ((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_FunctionDefinitionRewriting_cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
              *)local_298);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_90._inn._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_e0._inner);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:121:14),_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/FunctionDefinitionRewriting.cpp:125:14),_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::Term_*>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::~FlatteningIterator(&local_128);
  Lib::OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>::~OptionBase
            (&local_188._current.
              super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::Term_*>_>_>
            );
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

Kernel::ClauseIterator FunctionDefinitionRewriting::generateClauses(Clause *premise)
{
  return pvi(premise->iterLits()
    .flatMap([](Literal *lit) {
      NonVariableNonTypeIterator nvi(lit);
      return pvi(pushPairIntoRightIterator(lit, getUniquePersistentIteratorFromPtr(&nvi)));
    })
    .flatMap([this](std::pair<Literal*, Term*> arg){
      return pvi(pushPairIntoRightIterator(arg,
        GeneratingInferenceEngine::_salg->getFunctionDefinitionHandler().getGeneralizations(arg.second)));
    })
    .map([premise](auto arg) {
      auto &qr = arg.second;
      bool temp;
      return (Clause*)performRewriting(premise, arg.first.first, TermList(arg.first.second), qr.data->clause,
        qr.data->literal, qr.data->term, qr.unifier, nullptr, temp,
        Inference(GeneratingInference2(InferenceRule::FUNCTION_DEFINITION_REWRITING, premise, qr.data->clause)));
    })
    .filter(NonzeroFn()));
}